

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyListValue::~IfcPropertyListValue(IfcPropertyListValue *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  undefined1 *puVar3;
  
  *(undefined ***)&this[-1].field_0x58 = &PTR__IfcPropertyListValue_00831030;
  *(undefined ***)&this->field_0x40 = &PTR__IfcPropertyListValue_008310a8;
  *(undefined ***)&this[-1].field_0xb0 = &PTR__IfcPropertyListValue_00831058;
  *(undefined ***)this = &PTR__IfcPropertyListValue_00831080;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x30 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x30);
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&this->field_0x10);
  *(undefined8 *)&this[-1].field_0x58 = 0x8311c0;
  *(undefined8 *)&this->field_0x40 = 0x8311e8;
  puVar3 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>.
             field_0x20;
  p_Var1 = &this[-1].Unit.ptr.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)puVar3 != p_Var1) {
    operator_delete(puVar3,(ulong)((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1));
  }
  pp_Var2 = this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>.
            _vptr_ObjectHelper;
  puVar3 = &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>.
            field_0x10;
  if (pp_Var2 != (_func_int **)puVar3) {
    operator_delete(pp_Var2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].field_0x58,0xc0);
  return;
}

Assistant:

IfcPropertyListValue() : Object("IfcPropertyListValue") {}